

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandMinisimp(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  printf("This command is currently disabled.\n");
  return 1;
}

Assistant:

int Abc_CommandMinisimp( Abc_Frame_t * pAbc, int argc, char ** argv )
{
#ifdef USE_MINISAT22
    extern int MainSimp(int argc, char** argv);
    MainSimp( argc, argv );
#else
    printf( "This command is currently disabled.\n" );
#endif
    return 1;
}